

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

string * path_directory(string *__return_storage_ptr__,string *name)

{
  path local_98;
  path local_58;
  
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_98,name);
  std::experimental::filesystem::v1::__cxx11::path::parent_path();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)__return_storage_ptr__,local_58._M_pathname._M_dataplus._M_p,
             local_58._M_pathname._M_dataplus._M_p + local_58._M_pathname._M_string_length);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_58);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_98);
  return __return_storage_ptr__;
}

Assistant:

std::string path_directory(const std::string& name)
{
    return fs::path(name).parent_path().string();
}